

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void scandir_cb(uv_fs_t *req)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  uv_dirent_t dent_00;
  uv_dirent_t dent;
  
  if (req == &scandir_req) {
    if (scandir_req.fs_type == UV_FS_SCANDIR) {
      if (scandir_req.result == 2) {
        if (scandir_req.ptr == (void *)0x0) {
          pcVar4 = "req->ptr";
          uVar2 = 0x268;
        }
        else {
          while (iVar1 = uv_fs_scandir_next(&scandir_req,&dent), pcVar4 = dent.name, iVar1 != -0xfff
                ) {
            pcVar3 = "file1";
            iVar1 = strcmp(dent.name,"file1");
            if (iVar1 != 0) {
              pcVar3 = "file2";
              iVar1 = strcmp(pcVar4,"file2");
              if (iVar1 != 0) {
                pcVar4 = "strcmp(dent.name, \"file1\") == 0 || strcmp(dent.name, \"file2\") == 0";
                uVar2 = 0x26b;
                goto LAB_0011dec9;
              }
            }
            dent_00.name = (char *)(ulong)dent.type;
            dent_00._8_8_ = pcVar3;
            assert_is_file_type(dent_00);
          }
          scandir_cb_count = scandir_cb_count + 1;
          if (scandir_req.path == (char *)0x0) {
            pcVar4 = "req->path";
            uVar2 = 0x26f;
          }
          else {
            iVar1 = bcmp(scandir_req.path,"test_dir",9);
            if (iVar1 == 0) {
              uv_fs_req_cleanup(&scandir_req);
              if (scandir_req.ptr == (void *)0x0) {
                return;
              }
              pcVar4 = "!req->ptr";
              uVar2 = 0x272;
            }
            else {
              pcVar4 = "memcmp(req->path, \"test_dir\\0\", 9) == 0";
              uVar2 = 0x270;
            }
          }
        }
      }
      else {
        pcVar4 = "req->result == 2";
        uVar2 = 0x267;
      }
    }
    else {
      pcVar4 = "req->fs_type == UV_FS_SCANDIR";
      uVar2 = 0x266;
    }
  }
  else {
    pcVar4 = "req == &scandir_req";
    uVar2 = 0x265;
  }
LAB_0011dec9:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar4);
  abort();
}

Assistant:

static void scandir_cb(uv_fs_t* req) {
  uv_dirent_t dent;
  ASSERT(req == &scandir_req);
  ASSERT(req->fs_type == UV_FS_SCANDIR);
  ASSERT(req->result == 2);
  ASSERT(req->ptr);

  while (UV_EOF != uv_fs_scandir_next(req, &dent)) {
    ASSERT(strcmp(dent.name, "file1") == 0 || strcmp(dent.name, "file2") == 0);
    assert_is_file_type(dent);
  }
  scandir_cb_count++;
  ASSERT(req->path);
  ASSERT(memcmp(req->path, "test_dir\0", 9) == 0);
  uv_fs_req_cleanup(req);
  ASSERT(!req->ptr);
}